

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

void oonf_rfc5444_remove_target(oonf_rfc5444_target *target)

{
  oonf_log_source oVar1;
  undefined8 uVar2;
  undefined1 local_7e [8];
  netaddr_str nbuf;
  oonf_rfc5444_target *target_local;
  
  oVar1 = _oonf_rfc5444_subsystem.logging;
  nbuf.buf._54_8_ = target;
  if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    uVar2 = netaddr_to_prefixstring(local_7e,&target->dst,0);
    oonf_log(2,oVar1,"src/base/oonf_rfc5444.c",0x354,0,0,
             "Remove target %s from interface %s on protocol %s (refcount was %d)",uVar2,
             *(undefined8 *)(nbuf.buf._54_8_ + 0x98),
             *(undefined8 *)(*(long *)(nbuf.buf._54_8_ + 0x98) + 0x10),
             *(undefined4 *)(nbuf.buf._54_8_ + 0x138));
  }
  if (*(int *)(nbuf.buf._54_8_ + 0x138) < 2) {
    avl_remove(*(long *)(nbuf.buf._54_8_ + 0x98) + 0x50,nbuf.buf._54_8_ + 0xa0);
    oonf_rfc5444_remove_interface
              (*(oonf_rfc5444_interface **)(nbuf.buf._54_8_ + 0x98),
               (oonf_rfc5444_interface_listener *)0x0);
    _destroy_target((oonf_rfc5444_target *)nbuf.buf._54_8_);
  }
  else {
    *(int *)(nbuf.buf._54_8_ + 0x138) = *(int *)(nbuf.buf._54_8_ + 0x138) + -1;
  }
  return;
}

Assistant:

void
oonf_rfc5444_remove_target(struct oonf_rfc5444_target *target) {
#ifdef OONF_LOG_INFO
  struct netaddr_str nbuf;
#endif

  OONF_INFO(LOG_RFC5444, "Remove target %s from interface %s on protocol %s (refcount was %d)",
    netaddr_to_string(&nbuf, &target->dst), target->interface->name, target->interface->protocol->name,
    target->_refcount);

  if (target->_refcount > 1) {
    /* target still in use */
    target->_refcount--;
    return;
  }

  /* remove from protocol tree */
  avl_remove(&target->interface->_target_tree, &target->_node);

  /* decrease protocol refcount */
  oonf_rfc5444_remove_interface(target->interface, NULL);

  /* remove target */
  _destroy_target(target);
}